

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  undefined4 uVar7;
  uint64_t uVar8;
  uint discriminant;
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  Fault f;
  uint local_1d8;
  uint replacementDiscriminant;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  Fault f_1;
  anon_class_8_1_a7e8901a _kjContextFunc801;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:801:5)>
  _kjContext801;
  Maybe<capnp::schema::Field::Reader> local_100;
  Maybe<capnp::schema::Node::Reader> local_c8;
  Maybe<capnp::schema::Field::Reader> local_90;
  Maybe<capnp::schema::Node::Reader> local_58;
  
  _kjContextFunc801.field = field;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:801:5)>
  ::ContextImpl(&_kjContext801,&_kjContextFunc801);
  uVar3 = (field->_reader).dataSize;
  discriminant = 0;
  if ((0x1f < uVar3) && (uVar1 = *(ushort *)((long)(field->_reader).data + 2), uVar1 != 0)) {
    discriminant = (uint)(ushort)~uVar1;
  }
  uVar4 = (replacement->_reader).dataSize;
  replacementDiscriminant = 0;
  if ((0x1f < uVar4) &&
     (uVar1 = *(ushort *)((long)(replacement->_reader).data + 2), replacementDiscriminant = 0,
     uVar1 != 0)) {
    replacementDiscriminant = (uint)(ushort)~uVar1;
  }
  _kjCondition.left = &discriminant;
  _kjCondition.right = &replacementDiscriminant;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = discriminant == replacementDiscriminant;
  if (discriminant != replacementDiscriminant) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x328,FAILED,"discriminant == replacementDiscriminant",
               "_kjCondition,\"Field discriminant changed.\"",&_kjCondition,
               (char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
    goto LAB_0019e6d0;
  }
  if (0x4f < uVar3) {
    pvVar5 = (field->_reader).data;
    sVar2 = *(short *)((long)pvVar5 + 8);
    if (sVar2 == 1) {
      if (0x4f < uVar4) {
        pvVar6 = (replacement->_reader).data;
        sVar2 = *(short *)((long)pvVar6 + 8);
        if (sVar2 == 1) {
          if (uVar3 < 0xc0) {
            _kjCondition.left = (uint *)0x0;
          }
          else {
            _kjCondition.left = *(uint **)((long)pvVar5 + 0x10);
          }
          if (uVar4 < 0xc0) {
            _kjCondition.right = (uint *)0x0;
          }
          else {
            _kjCondition.right = *(uint **)((long)pvVar6 + 0x10);
          }
          _kjCondition.op.content.ptr = " == ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = _kjCondition.left == _kjCondition.right;
          if (_kjCondition.left != _kjCondition.right) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[17]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x34c,FAILED,
                       "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                       "_kjCondition,\"group id changed\"",
                       (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                       (char (*) [17])"group id changed");
            this->compatibility = INCOMPATIBLE;
            kj::_::Debug::Fault::~Fault(&f);
          }
          goto LAB_0019e6d0;
        }
        if (sVar2 != 0) goto LAB_0019e6d0;
      }
      f.exception = (Exception *)(replacement->_reader).segment;
      capnp::schema::Field::Slot::Reader::getType((Reader *)&_kjCondition,(Reader *)&f);
      if ((field->_reader).dataSize < 0xc0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint64_t *)((long)(field->_reader).data + 0x10);
      }
      local_c8.ptr.isSet = true;
      local_c8.ptr.field_1.value._reader.segment = (this->replacementNode)._reader.segment;
      local_c8.ptr.field_1.value._reader.capTable = (this->replacementNode)._reader.capTable;
      local_c8.ptr.field_1.value._reader.data = (this->replacementNode)._reader.data;
      local_c8.ptr.field_1.value._reader.pointers = (this->replacementNode)._reader.pointers;
      local_c8.ptr.field_1._32_4_ = (this->replacementNode)._reader.dataSize;
      local_c8.ptr.field_1._36_2_ = (this->replacementNode)._reader.pointerCount;
      local_c8.ptr.field_1._38_2_ = *(undefined2 *)&(this->replacementNode)._reader.field_0x26;
      local_c8.ptr.field_1._40_8_ = *(undefined8 *)&(this->replacementNode)._reader.nestingLimit;
      local_100.ptr.isSet = true;
      local_100.ptr.field_1.value._reader.segment = (replacement->_reader).segment;
      local_100.ptr.field_1.value._reader.capTable = (replacement->_reader).capTable;
      local_100.ptr.field_1.value._reader.data = (replacement->_reader).data;
      local_100.ptr.field_1.value._reader.pointers = (replacement->_reader).pointers;
      local_100.ptr.field_1._32_4_ = (replacement->_reader).dataSize;
      local_100.ptr.field_1._36_2_ = (replacement->_reader).pointerCount;
      local_100.ptr.field_1._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
      local_100.ptr.field_1._40_8_ = *(undefined8 *)&(replacement->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&_kjCondition,uVar8,&local_c8,&local_100);
      goto LAB_0019e6d0;
    }
    if (sVar2 != 0) goto LAB_0019e6d0;
  }
  _kjCondition.left = (uint *)(field->_reader).segment;
  _kjCondition.right = (uint *)(field->_reader).capTable;
  _kjCondition.op.content.ptr = (char *)(field->_reader).data;
  _kjCondition.op.content.size_ = (size_t)(field->_reader).pointers;
  _kjCondition._32_8_ = *(undefined8 *)&(field->_reader).dataSize;
  if (0x4f < uVar4) {
    sVar2 = *(short *)((long)(replacement->_reader).data + 8);
    if (sVar2 == 1) {
      capnp::schema::Field::Slot::Reader::getType((Reader *)&f,(Reader *)&_kjCondition);
      if ((replacement->_reader).dataSize < 0xc0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
      }
      local_58.ptr.isSet = true;
      local_58.ptr.field_1.value._reader.segment = (this->existingNode)._reader.segment;
      local_58.ptr.field_1.value._reader.capTable = (this->existingNode)._reader.capTable;
      local_58.ptr.field_1.value._reader.data = (this->existingNode)._reader.data;
      local_58.ptr.field_1.value._reader.pointers = (this->existingNode)._reader.pointers;
      local_58.ptr.field_1._32_4_ = (this->existingNode)._reader.dataSize;
      local_58.ptr.field_1._36_2_ = (this->existingNode)._reader.pointerCount;
      local_58.ptr.field_1._38_2_ = *(undefined2 *)&(this->existingNode)._reader.field_0x26;
      local_58.ptr.field_1._40_8_ = *(undefined8 *)&(this->existingNode)._reader.nestingLimit;
      local_90.ptr.isSet = true;
      local_90.ptr.field_1.value._reader.segment = (field->_reader).segment;
      local_90.ptr.field_1.value._reader.capTable = (field->_reader).capTable;
      local_90.ptr.field_1.value._reader.data = (field->_reader).data;
      local_90.ptr.field_1.value._reader.pointers = (field->_reader).pointers;
      local_90.ptr.field_1._32_4_ = (field->_reader).dataSize;
      local_90.ptr.field_1._36_2_ = (field->_reader).pointerCount;
      local_90.ptr.field_1._38_2_ = *(undefined2 *)&(field->_reader).field_0x26;
      local_90.ptr.field_1._40_8_ = *(undefined8 *)&(field->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&f,uVar8,&local_58,&local_90);
      goto LAB_0019e6d0;
    }
    if (sVar2 != 0) goto LAB_0019e6d0;
  }
  f.exception = (Exception *)(replacement->_reader).segment;
  pvVar5 = (replacement->_reader).data;
  uVar7 = (replacement->_reader).dataSize;
  capnp::schema::Field::Slot::Reader::getType((Reader *)&_kjCondition_1,(Reader *)&_kjCondition);
  capnp::schema::Field::Slot::Reader::getType((Reader *)&f_1,(Reader *)&f);
  checkCompatibility(this,(Reader *)&_kjCondition_1,(Reader *)&f_1,NO_UPGRADE_TO_STRUCT);
  capnp::schema::Field::Slot::Reader::getDefaultValue
            ((Reader *)&_kjCondition_1,(Reader *)&_kjCondition);
  capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)&f_1,(Reader *)&f);
  checkDefaultCompatibility(this,(Reader *)&_kjCondition_1,(Reader *)&f_1);
  _kjCondition_1.right = 0;
  _kjCondition_1.left = 0;
  if (0x3f < (uint)_kjCondition._32_4_) {
    _kjCondition_1.left = *(uint *)(_kjCondition.op.content.ptr + 4);
  }
  if (0x3f < (uint)uVar7) {
    _kjCondition_1.right = *(uint *)((long)pvVar5 + 4);
  }
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = _kjCondition_1.left == _kjCondition_1.right;
  if (!_kjCondition_1.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[23]>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x338,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
               "_kjCondition,\"field position changed\"",&_kjCondition_1,
               (char (*) [23])"field position changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f_1);
  }
LAB_0019e6d0:
  kj::_::Debug::Context::~Context(&_kjContext801.super_Context);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }